

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::HashSetResizeHelper::
GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,void>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
          (HashSetResizeHelper *this,CommonFields *c,
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>
          *alloc_ref)

{
  ctrl_t *pcVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  
  uVar5 = this->old_capacity_;
  if (7 < uVar5) {
    __assert_fail("(old_capacity_ < Group::kWidth / 2) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x856,
                  "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>]"
                 );
  }
  if ((c->capacity_ < 0x11) && (uVar5 < c->capacity_)) {
    if (this->was_soo_ != true) {
      if (uVar5 != 0) {
        pcVar1 = (this->old_heap_or_soo_).heap.control;
        puVar4 = (undefined8 *)((long)(this->old_heap_or_soo_).heap.slot_array.p + 0x10);
        uVar7 = 0;
        puVar2 = *(undefined8 **)((long)&c->heap_or_soo_ + 8);
        do {
          puVar6 = puVar2 + 5;
          if (kSentinel < pcVar1[uVar7]) {
            *puVar6 = puVar2 + 7;
            if (puVar4 == (undefined8 *)puVar4[-2]) {
              uVar3 = puVar4[1];
              puVar2[7] = *puVar4;
              puVar2[8] = uVar3;
            }
            else {
              *puVar6 = (undefined8 *)puVar4[-2];
              puVar2[7] = *puVar4;
            }
            puVar2[6] = puVar4[-1];
            puVar4[-2] = puVar4;
            puVar4[-1] = 0;
            *(undefined1 *)puVar4 = 0;
            *(undefined4 *)(puVar2 + 9) = *(undefined4 *)(puVar4 + 2);
            uVar5 = this->old_capacity_;
          }
          uVar7 = uVar7 + 1;
          puVar4 = puVar4 + 5;
          puVar2 = puVar6;
        } while (uVar7 < uVar5);
      }
      return;
    }
    __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7ea,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
  }
  __assert_fail("(IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity())) && \"Try enabling sanitizers.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x858,
                "void absl::container_internal::HashSetResizeHelper::GrowSizeIntoSingleGroup(CommonFields &, Alloc &) [PolicyTraits = absl::container_internal::hash_policy_traits<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>]"
               );
}

Assistant:

void GrowSizeIntoSingleGroup(CommonFields& c, Alloc& alloc_ref) {
    ABSL_SWISSTABLE_ASSERT(old_capacity_ < Group::kWidth / 2);
    ABSL_SWISSTABLE_ASSERT(
        IsGrowingIntoSingleGroupApplicable(old_capacity_, c.capacity()));
    using slot_type = typename PolicyTraits::slot_type;
    ABSL_SWISSTABLE_ASSERT(is_single_group(c.capacity()));

    auto* new_slots = static_cast<slot_type*>(c.slot_array()) + 1;
    auto* old_slots_ptr = static_cast<slot_type*>(old_slots());
    auto* old_ctrl_ptr = old_ctrl();

    for (size_t i = 0; i < old_capacity_; ++i, ++new_slots) {
      if (IsFull(old_ctrl_ptr[i])) {
        SanitizerUnpoisonMemoryRegion(new_slots, sizeof(slot_type));
        PolicyTraits::transfer(&alloc_ref, new_slots, old_slots_ptr + i);
      }
    }
    PoisonSingleGroupEmptySlots(c, sizeof(slot_type));
  }